

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tick.h
# Opt level: O2

void __thiscall Tick::Tick(Tick *this,microseconds timeBetweenTicks,function<void_()> *onTick)

{
  anon_class_8_1_8991fb9c_for__M_head_impl local_18;
  
  std::function<void_()>::function(&this->onTick_,onTick);
  (this->timeBetweenTicks_).__r = timeBetweenTicks.__r;
  (this->active_)._M_base._M_i = true;
  local_18.this = this;
  std::thread::
  thread<Tick::Tick(std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>&&)::_lambda()_1_,,void>
            (&this->timerThread_,&local_18);
  return;
}

Assistant:

Tick(std::chrono::microseconds timeBetweenTicks,
         std::function<void()>&& onTick)
        : timeBetweenTicks_(timeBetweenTicks)
        , onTick_(std::move(onTick))
        , active_(true)
        , timerThread_([this] { Loop(); }) // note initialization order is very important here; 
                                            // thread should start last
    {}